

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O1

void deqp::gles3::Functional::anon_unknown_0::addTestIterations
               (DrawTest *test,DrawTestSpec *baseSpec,TestIterationType type)

{
  char *description;
  DrawTestSpec spec;
  DrawTestSpec local_68;
  
  local_68.baseVertex = baseSpec->baseVertex;
  local_68.apiType.m_bits = (baseSpec->apiType).m_bits;
  local_68.primitive = baseSpec->primitive;
  local_68.primitiveCount = baseSpec->primitiveCount;
  local_68.drawMethod = baseSpec->drawMethod;
  local_68.indexType = baseSpec->indexType;
  local_68.indexPointerOffset = baseSpec->indexPointerOffset;
  local_68.indexStorage = baseSpec->indexStorage;
  local_68.first = baseSpec->first;
  local_68.indexMin = baseSpec->indexMin;
  local_68.indexMax = baseSpec->indexMax;
  local_68.instanceCount = baseSpec->instanceCount;
  local_68.indirectOffset = baseSpec->indirectOffset;
  std::
  vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::vector(&local_68.attribs,&baseSpec->attribs);
  if (type == TYPE_INSTANCE_COUNT) {
    local_68.instanceCount = 1;
    deqp::gls::DrawTest::addIteration(test,&local_68,"instance count = 1");
    local_68.instanceCount = 4;
    deqp::gls::DrawTest::addIteration(test,&local_68,"instance count = 4");
    local_68.instanceCount = 0xb;
    description = "instance count = 11";
  }
  else if (type == TYPE_DRAW_COUNT) {
    local_68.primitiveCount = 1;
    deqp::gls::DrawTest::addIteration(test,&local_68,"draw count = 1");
    local_68.primitiveCount = 5;
    deqp::gls::DrawTest::addIteration(test,&local_68,"draw count = 5");
    local_68.primitiveCount = 0x19;
    description = "draw count = 25";
  }
  else {
    local_68.indexMin = 0;
    local_68.indexMax = 0x17;
    deqp::gls::DrawTest::addIteration(test,&local_68,"index range = [0, 23]");
    local_68.indexMin = 0x17;
    local_68.indexMax = 0x28;
    deqp::gls::DrawTest::addIteration(test,&local_68,"index range = [23, 40]");
    if (local_68.primitive != PRIMITIVE_POINTS) goto LAB_00661ce9;
    local_68.indexMin = 5;
    local_68.indexMax = 5;
    description = "index range = [5, 5]";
  }
  deqp::gls::DrawTest::addIteration(test,&local_68,description);
LAB_00661ce9:
  if (local_68.attribs.
      super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.attribs.
                    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.attribs.
                          super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.attribs.
                          super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void addTestIterations (gls::DrawTest* test, const gls::DrawTestSpec& baseSpec, TestIterationType type)
{
	gls::DrawTestSpec spec(baseSpec);

	if (type == TYPE_DRAW_COUNT)
	{
		spec.primitiveCount = 1;
		test->addIteration(spec, "draw count = 1");

		spec.primitiveCount = 5;
		test->addIteration(spec, "draw count = 5");

		spec.primitiveCount = 25;
		test->addIteration(spec, "draw count = 25");
	}
	else if (type == TYPE_INSTANCE_COUNT)
	{
		spec.instanceCount = 1;
		test->addIteration(spec, "instance count = 1");

		spec.instanceCount = 4;
		test->addIteration(spec, "instance count = 4");

		spec.instanceCount = 11;
		test->addIteration(spec, "instance count = 11");
	}
	else if (type == TYPE_INDEX_RANGE)
	{
		spec.indexMin = 0;
		spec.indexMax = 23;
		test->addIteration(spec, "index range = [0, 23]");

		spec.indexMin = 23;
		spec.indexMax = 40;
		test->addIteration(spec, "index range = [23, 40]");

		// Only makes sense with points
		if (spec.primitive == gls::DrawTestSpec::PRIMITIVE_POINTS)
		{
			spec.indexMin = 5;
			spec.indexMax = 5;
			test->addIteration(spec, "index range = [5, 5]");
		}
	}
	else
		DE_ASSERT(false);
}